

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O1

bool __thiscall QDir::cd(QDir *this,QString *dirName)

{
  long lVar1;
  Data *pDVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  bool bVar5;
  bool bVar6;
  qsizetype qVar7;
  QDirPrivate *pQVar8;
  qsizetype in_R8;
  QFileSystemEntry *this_00;
  long in_FS_OFFSET;
  QLatin1StringView s;
  QStringView lhs;
  QLatin1StringView rhs;
  unique_ptr<QDirPrivate,_std::default_delete<QDirPrivate>_> dir;
  QFileInfo local_90;
  QString local_88;
  QString local_68;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (dirName->d).size;
  bVar5 = true;
  if ((lVar1 == 0) || ((pQVar8 = (this->d_ptr).d.ptr, lVar1 == 1 && (*(dirName->d).ptr == L'.'))))
  goto LAB_0010ca14;
  local_48.d.d = (Data *)0x0;
  local_48.d.ptr = (char16_t *)0x0;
  local_48.d.size = 0;
  bVar5 = isRelativePath(dirName);
  if (bVar5) {
    this_00 = &pQVar8->dirEntry;
    QFileSystemEntry::filePath(&local_68,this_00);
    pcVar4 = local_48.d.ptr;
    pDVar3 = local_48.d.d;
    qVar7 = local_68.d.size;
    pDVar2 = local_68.d.d;
    local_68.d.d = local_48.d.d;
    local_48.d.d = pDVar2;
    local_48.d.ptr = local_68.d.ptr;
    local_68.d.ptr = pcVar4;
    local_68.d.size = local_48.d.size;
    local_48.d.size = qVar7;
    if ((QDirPrivate *)pDVar3 != (QDirPrivate *)0x0) {
      LOCK();
      (((QSharedData *)&pDVar3->super_QArrayData)->ref).super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           (((QSharedData *)&pDVar3->super_QArrayData)->ref).super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QSharedData *)&pDVar3->super_QArrayData)->ref).super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
      }
    }
    bVar5 = QString::endsWith(&local_48,(QChar)0x2f,CaseSensitive);
    if (!bVar5) {
      QString::append(&local_48,(QChar)0x2f);
    }
    QString::append(&local_48,dirName);
    local_68.d.d = (Data *)(dirName->d).ptr;
    local_68.d.ptr = (char16_t *)(dirName->d).size;
    bVar6 = false;
    qVar7 = QStringView::indexOf((QStringView *)&local_68,(QChar)0x2f,0,CaseSensitive);
    bVar5 = true;
    if (qVar7 < 0) {
      if ((dirName->d).size == 2) {
        lhs.m_size = (qsizetype)"..";
        lhs.m_data = (storage_type_conflict *)0x2;
        rhs.m_size = in_R8;
        rhs.m_data = (char *)0x2;
        bVar6 = QtPrivate::equalStrings((QtPrivate *)(dirName->d).ptr,lhs,rhs);
        if (bVar6) {
          bVar6 = false;
          goto LAB_0010c897;
        }
      }
      QFileSystemEntry::filePath(&local_68,this_00);
      bVar6 = true;
      if (local_68.d.size == 1) {
        bVar5 = *local_68.d.ptr == L'.';
      }
      else {
        bVar5 = false;
      }
    }
LAB_0010c897:
    if ((bVar6) && ((QDirPrivate *)local_68.d.d != (QDirPrivate *)0x0)) {
      LOCK();
      (((QSharedData *)&(local_68.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           (((QSharedData *)&(local_68.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QSharedData *)&(local_68.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (!bVar5) goto LAB_0010c988;
    bVar5 = qt_cleanPath(&local_48);
    if (bVar5) {
      s.m_size = 2;
      s.m_data = "..";
      bVar5 = QString::startsWith(&local_48,s,CaseSensitive);
      if (bVar5) {
        QFileInfo::QFileInfo(&local_90,&local_48);
        QFileInfo::absoluteFilePath(&local_88,&local_90);
        pcVar4 = local_48.d.ptr;
        pDVar3 = local_48.d.d;
        qVar7 = local_88.d.size;
        pDVar2 = local_88.d.d;
        local_88.d.d = local_48.d.d;
        local_48.d.d = pDVar2;
        local_48.d.ptr = local_88.d.ptr;
        local_88.d.ptr = pcVar4;
        local_88.d.size = local_48.d.size;
        local_48.d.size = qVar7;
        if ((QDirPrivate *)pDVar3 != (QDirPrivate *)0x0) {
          LOCK();
          (((QSharedData *)&pDVar3->super_QArrayData)->ref).super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
               (((QSharedData *)&pDVar3->super_QArrayData)->ref).super_QAtomicInteger<int>.
               super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QSharedData *)&pDVar3->super_QArrayData)->ref).super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
          }
        }
        QFileInfo::~QFileInfo(&local_90);
      }
      goto LAB_0010c988;
    }
    bVar5 = false;
  }
  else {
    QString::operator=(&local_48,dirName);
    qt_cleanPath(&local_48);
LAB_0010c988:
    local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar8 = (QDirPrivate *)operator_new(0x118);
    QDirPrivate::QDirPrivate(pQVar8,(this->d_ptr).d.ptr);
    local_88.d.d = (Data *)pQVar8;
    QDirPrivate::setPath(pQVar8,&local_48);
    bVar5 = QDirPrivate::exists((QDirPrivate *)local_88.d.d);
    pDVar2 = local_88.d.d;
    if (bVar5) {
      local_88.d.d = (Data *)0x0;
      QSharedDataPointer<QDirPrivate>::reset(&this->d_ptr,(QDirPrivate *)pDVar2);
    }
    std::unique_ptr<QDirPrivate,_std::default_delete<QDirPrivate>_>::~unique_ptr
              ((unique_ptr<QDirPrivate,_std::default_delete<QDirPrivate>_> *)&local_88);
  }
  if ((QDirPrivate *)local_48.d.d != (QDirPrivate *)0x0) {
    LOCK();
    (((QSharedData *)&(local_48.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&(local_48.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QSharedData *)&(local_48.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_0010ca14:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool QDir::cd(const QString &dirName)
{
    // Don't detach just yet.
    const QDirPrivate * const d = d_ptr.constData();

    if (dirName.isEmpty() || dirName == u'.')
        return true;
    QString newPath;
    if (isAbsolutePath(dirName)) {
        newPath = dirName;
        qt_cleanPath(&newPath);
    } else {
        newPath = d->dirEntry.filePath();
        if (!newPath.endsWith(u'/'))
            newPath += u'/';
        newPath += dirName;
        if (dirName.indexOf(u'/') >= 0
            || dirName == ".."_L1
            || d->dirEntry.filePath() == u'.') {
            if (!qt_cleanPath(&newPath))
                return false;
            /*
              If newPath starts with .., we convert it to absolute to
              avoid infinite looping on

                  QDir dir(".");
                  while (dir.cdUp())
                      ;
            */
            if (newPath.startsWith(".."_L1)) {
                newPath = QFileInfo(newPath).absoluteFilePath();
            }
        }
    }

    std::unique_ptr<QDirPrivate> dir(new QDirPrivate(*d_ptr.constData()));
    dir->setPath(newPath);
    if (!dir->exists())
        return false;

    d_ptr = dir.release();
    return true;
}